

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::LockFile(PosixEnv *this,string *filename,FileLock **lock)

{
  pthread_mutex_t *__mutex;
  undefined8 uVar1;
  int __fd;
  int iVar2;
  undefined8 *puVar3;
  int *piVar4;
  undefined8 *in_RCX;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  Slice local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Slice local_40;
  
  *in_RCX = 0;
  __fd = open((char *)*lock,0x80042,0x1a4);
  if (__fd < 0) {
    piVar4 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)lock,*piVar4);
  }
  else {
    __mutex = (pthread_mutex_t *)(filename + 6);
    std::mutex::lock((mutex *)&__mutex->__data);
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&filename[7]._M_string_length,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock);
    pthread_mutex_unlock(__mutex);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      close(__fd);
      std::operator+(&local_60,"lock ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock);
      local_40.data_ = local_60._M_dataplus._M_p;
      local_40.size_ = local_60._M_string_length;
      local_70.data_ = "already held by process";
      local_70.size_ = 0x17;
      Status::IOError((Status *)this,&local_40,&local_70);
    }
    else {
      iVar2 = LockOrUnlock(__fd,true);
      if (iVar2 != -1) {
        puVar3 = (undefined8 *)operator_new(0x30);
        std::__cxx11::string::string((string *)&local_90,(string *)lock);
        uVar1 = local_88;
        *puVar3 = &PTR__PosixFileLock_00116a98;
        *(int *)(puVar3 + 1) = __fd;
        puVar3[2] = puVar3 + 4;
        if (local_90 == &local_80) {
          puVar3[4] = CONCAT71(uStack_7f,local_80);
          puVar3[5] = uStack_78;
        }
        else {
          puVar3[2] = local_90;
          puVar3[4] = CONCAT71(uStack_7f,local_80);
        }
        local_88 = 0;
        puVar3[3] = uVar1;
        local_80 = 0;
        *in_RCX = puVar3;
        local_90 = &local_80;
        std::__cxx11::string::_M_dispose();
        (this->super_Env)._vptr_Env = (_func_int **)0x0;
        return (Status)(char *)this;
      }
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      close(__fd);
      PosixLockTable::Remove((PosixLockTable *)&__mutex->__data,(string *)lock);
      std::operator+(&local_60,"lock ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock);
      PosixError((anon_unknown_1 *)this,&local_60,iVar2);
    }
    std::__cxx11::string::_M_dispose();
  }
  return (Status)(char *)this;
}

Assistant:

Status LockFile(const std::string& filename, FileLock** lock) override {
    *lock = nullptr;

    int fd = ::open(filename.c_str(), O_RDWR | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!locks_.Insert(filename)) {
      ::close(fd);
      return Status::IOError("lock " + filename, "already held by process");
    }

    if (LockOrUnlock(fd, true) == -1) {
      int lock_errno = errno;
      ::close(fd);
      locks_.Remove(filename);
      return PosixError("lock " + filename, lock_errno);
    }

    *lock = new PosixFileLock(fd, filename);
    return Status::OK();
  }